

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.hpp
# Opt level: O2

void __thiscall
duckdb::SingleFileStorageManager::~SingleFileStorageManager(SingleFileStorageManager *this)

{
  (this->super_StorageManager)._vptr_StorageManager =
       (_func_int **)&PTR__SingleFileStorageManager_027c3428;
  ::std::unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>::
  ~unique_ptr(&(this->table_io_manager).
               super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>
             );
  ::std::unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>::~unique_ptr
            (&(this->block_manager).
              super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>);
  StorageManager::~StorageManager(&this->super_StorageManager);
  return;
}

Assistant:

SingleFileStorageManager() = delete;